

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

Block * __thiscall google::protobuf::Arena::FindBlock(Arena *this,void *me)

{
  bool bVar1;
  Block *local_20;
  Block *b;
  void *me_local;
  Arena *this_local;
  
  local_20 = (Block *)internal::Acquire_Load((Atomic64 *)(this + 8));
  while( true ) {
    bVar1 = false;
    if (local_20 != (Block *)0x0) {
      bVar1 = local_20->owner != me;
    }
    if (!bVar1) break;
    local_20 = local_20->next;
  }
  return local_20;
}

Assistant:

Arena::Block* Arena::FindBlock(void* me) {
  // TODO(sanjay): We might want to keep a separate list with one
  // entry per thread.
  Block* b = reinterpret_cast<Block*>(google::protobuf::internal::Acquire_Load(&blocks_));
  while (b != NULL && b->owner != me) {
    b = b->next;
  }
  return b;
}